

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# names.cpp
# Opt level: O2

void __thiscall
ORPG::NameGenerator::NameGenerator(NameGenerator *this,string *_race,string *_gender)

{
  ORPG::Core::DATA_LOCATION_abi_cxx11_();
  std::__cxx11::string::string((string *)&this->race,(string *)_race);
  std::__cxx11::string::string((string *)&this->raceFile,(string *)_race);
  std::__cxx11::string::string((string *)&this->gender,(string *)_gender);
  std::__cxx11::string::append((char *)this);
  Initialize(this);
  return;
}

Assistant:

NameGenerator::NameGenerator(string _race, string _gender)
        :location(Core::DATA_LOCATION()), race(_race), raceFile(_race), gender(_gender) {
        location += "/names";

        Initialize();
    }